

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

int duckdb_brotli::InitializeCompoundDictionaryCopy
              (BrotliDecoderStateInternal *s,int address,int length)

{
  BrotliDecoderCompoundDictionary *pBVar1;
  bool bVar2;
  int in_EDX;
  int in_ESI;
  BrotliDecoderStateInternal *in_RDI;
  int index;
  BrotliDecoderCompoundDictionary *addon;
  uint local_24;
  uint local_4;
  
  pBVar1 = in_RDI->compound_dictionary;
  EnsureCoumpoundDictionaryInitialized(in_RDI);
  local_24 = (uint)pBVar1->block_map[in_ESI >> ((byte)pBVar1->block_bits & 0x1f)];
  while (pBVar1->chunk_offsets[(int)(local_24 + 1)] <= in_ESI) {
    local_24 = local_24 + 1;
  }
  bVar2 = in_ESI + in_EDX <= pBVar1->total_size;
  if (bVar2) {
    in_RDI->dist_rb[(int)(in_RDI->dist_rb_idx & 3)] = in_RDI->distance_code;
    in_RDI->dist_rb_idx = in_RDI->dist_rb_idx + 1;
    in_RDI->meta_block_remaining_len = in_RDI->meta_block_remaining_len - in_EDX;
    pBVar1->br_index = local_24;
    pBVar1->br_offset = in_ESI - pBVar1->chunk_offsets[(int)local_24];
    pBVar1->br_length = in_EDX;
    pBVar1->br_copied = 0;
  }
  local_4 = (uint)bVar2;
  return local_4;
}

Assistant:

static BROTLI_BOOL InitializeCompoundDictionaryCopy(BrotliDecoderState *s, int address, int length) {
	BrotliDecoderCompoundDictionary *addon = s->compound_dictionary;
	int index;
	EnsureCoumpoundDictionaryInitialized(s);
	index = addon->block_map[address >> addon->block_bits];
	while (address >= addon->chunk_offsets[index + 1])
		index++;
	if (addon->total_size < address + length)
		return BROTLI_FALSE;
	/* Update the recent distances cache. */
	s->dist_rb[s->dist_rb_idx & 3] = s->distance_code;
	++s->dist_rb_idx;
	s->meta_block_remaining_len -= length;
	addon->br_index = index;
	addon->br_offset = address - addon->chunk_offsets[index];
	addon->br_length = length;
	addon->br_copied = 0;
	return BROTLI_TRUE;
}